

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O2

void __thiscall duckdb::Command::Command(Command *this,SQLLogicTestRunner *runner)

{
  this->_vptr_Command = (_func_int **)&PTR__Command_00573c40;
  this->runner = runner;
  (this->connection_name)._M_dataplus._M_p = (pointer)&(this->connection_name).field_2;
  (this->connection_name)._M_string_length = 0;
  (this->connection_name).field_2._M_local_buf[0] = '\0';
  (this->base_sql_query)._M_dataplus._M_p = (pointer)&(this->base_sql_query).field_2;
  (this->base_sql_query)._M_string_length = 0;
  (this->base_sql_query).field_2._M_local_buf[0] = '\0';
  (this->file_name)._M_dataplus._M_p = (pointer)&(this->file_name).field_2;
  (this->file_name)._M_string_length = 0;
  (this->file_name).field_2._M_local_buf[0] = '\0';
  (this->conditions).super_vector<duckdb::Condition,_std::allocator<duckdb::Condition>_>.
  super__Vector_base<duckdb::Condition,_std::allocator<duckdb::Condition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conditions).super_vector<duckdb::Condition,_std::allocator<duckdb::Condition>_>.
  super__Vector_base<duckdb::Condition,_std::allocator<duckdb::Condition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conditions).super_vector<duckdb::Condition,_std::allocator<duckdb::Condition>_>.
  super__Vector_base<duckdb::Condition,_std::allocator<duckdb::Condition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Command::Command(SQLLogicTestRunner &runner) : runner(runner) {
}